

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

LY_ERR lyd_validate_minmax(lyd_node *first,lyd_node *parent,lysc_node *snode,uint32_t min,
                          uint32_t max,uint32_t val_opts)

{
  ly_ctx *plVar1;
  LY_ERR LVar2;
  lysc_when *plVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  bool bVar8;
  lysc_when *disabled;
  lyd_node *iter;
  lysc_when *local_48;
  lyd_node *local_40;
  lyd_node *local_38;
  
  local_38 = parent;
  if (max == 0 && min == 0) {
    __assert_fail("min || max",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                  ,0x47b,
                  "LY_ERR lyd_validate_minmax(const struct lyd_node *, const struct lyd_node *, const struct lysc_node *, uint32_t, uint32_t, uint32_t)"
                 );
  }
  uVar7 = 0;
  lyd_find_sibling_val(first,snode,(char *)0x0,0,&local_40);
  if (local_40 != (lyd_node *)0x0) {
    uVar4 = 0;
    do {
      uVar7 = uVar4;
      if (local_40->schema != snode) break;
      uVar4 = uVar7 + 1;
      if (min == 0) {
        min = 0;
      }
      else {
        bVar8 = uVar4 == min;
        if (bVar8) {
          min = 0;
        }
        uVar5 = 0;
        if (bVar8 && max == 0) goto LAB_001bcb40;
      }
      uVar5 = min;
      if ((max < uVar4 && max != 0) || (local_40 = local_40->next, local_40 == (lyd_node *)0x0))
      goto LAB_001bcb40;
    } while( true );
  }
LAB_001bcb46:
  if (min != 0) {
    if (min <= uVar7) {
      __assert_fail("count < min",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                    ,0x48f,
                    "LY_ERR lyd_validate_minmax(const struct lyd_node *, const struct lyd_node *, const struct lysc_node *, uint32_t, uint32_t, uint32_t)"
                   );
    }
    local_48 = (lysc_when *)0x0;
    plVar3 = lysc_has_when(snode);
    if ((plVar3 != (lysc_when *)0x0) &&
       (LVar2 = lyd_validate_dummy_when(first,local_38,snode,&local_48), LVar2 != LY_SUCCESS)) {
      return LVar2;
    }
    if (local_48 == (lysc_when *)0x0) {
      ly_log_location(snode,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      plVar1 = snode->module->ctx;
      if ((val_opts & 8) != 0) {
        ly_log(plVar1,LY_LLWRN,LY_SUCCESS,"Too few \"%s\" instances.",snode->name);
        uVar6 = 1;
        uVar5 = 0;
        goto LAB_001bcc7f;
      }
      ly_vlog(plVar1,"too-few-elements",LYVE_DATA,"Too few \"%s\" instances.");
      uVar6 = 1;
      uVar5 = 0;
      goto LAB_001bcc52;
    }
  }
  if (uVar7 <= max || max == 0) {
    return LY_SUCCESS;
  }
  ly_log_location((lysc_node *)0x0,local_40,(char *)0x0,(ly_in *)0x0);
  plVar1 = snode->module->ctx;
  if ((val_opts & 8) != 0) {
    ly_log(plVar1,LY_LLWRN,LY_SUCCESS,"Too many \"%s\" instances.",snode->name);
    uVar6 = 0;
    uVar5 = 1;
LAB_001bcc7f:
    ly_log_location_revert(uVar6,uVar5,0,0);
    return LY_SUCCESS;
  }
  ly_vlog(plVar1,"too-many-elements",LYVE_DATA,"Too many \"%s\" instances.");
  uVar6 = 0;
  uVar5 = 1;
LAB_001bcc52:
  ly_log_location_revert(uVar6,uVar5,0,0);
  return LY_EVALID;
LAB_001bcb40:
  min = uVar5;
  uVar7 = uVar7 + 1;
  goto LAB_001bcb46;
}

Assistant:

static LY_ERR
lyd_validate_minmax(const struct lyd_node *first, const struct lyd_node *parent, const struct lysc_node *snode,
        uint32_t min, uint32_t max, uint32_t val_opts)
{
    uint32_t count = 0;
    struct lyd_node *iter;
    const struct lysc_when *disabled;

    assert(min || max);

    LYD_LIST_FOR_INST(first, snode, iter) {
        ++count;

        if (min && (count == min)) {
            /* satisfied */
            min = 0;
            if (!max) {
                /* nothing more to check */
                break;
            }
        }
        if (max && (count > max)) {
            /* not satisifed */
            break;
        }
    }

    if (min) {
        assert(count < min);

        disabled = NULL;
        if (lysc_has_when(snode)) {
            /* if there are any when conditions, they must be true for a validation error */
            LY_CHECK_RET(lyd_validate_dummy_when(first, parent, snode, &disabled));
        }

        if (disabled) {
            /* satisfied */
            min = 0;
        }
    }
    if (max && (count <= max)) {
        /* satisfied */
        max = 0;
    }

    if (min) {
        if (val_opts & LYD_VALIDATE_OPERATIONAL) {
            /* only a warning */
            LOG_LOCSET(snode, NULL);
            LOGWRN(snode->module->ctx, "Too few \"%s\" instances.", snode->name);
            LOG_LOCBACK(1, 0);
        } else {
            LOG_LOCSET(snode, NULL);
            LOGVAL_APPTAG(snode->module->ctx, "too-few-elements", LY_VCODE_NOMIN, snode->name);
            LOG_LOCBACK(1, 0);
            return LY_EVALID;
        }
    } else if (max) {
        if (val_opts & LYD_VALIDATE_OPERATIONAL) {
            /* only a warning */
            LOG_LOCSET(NULL, iter);
            LOGWRN(snode->module->ctx, "Too many \"%s\" instances.", snode->name);
            LOG_LOCBACK(0, 1);
        } else {
            LOG_LOCSET(NULL, iter);
            LOGVAL_APPTAG(snode->module->ctx, "too-many-elements", LY_VCODE_NOMAX, snode->name);
            LOG_LOCBACK(0, 1);
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}